

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O2

sexp_conflict sexp_heap_walk(sexp_conflict ctx,int depth,int printp)

{
  char *pcVar1;
  sexp_uint_t sVar2;
  sexp_conflict psVar3;
  sexp psVar4;
  sexp psVar5;
  uint uVar6;
  undefined8 uVar7;
  sexp_conflict psVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  sexp_conflict x;
  ulong uVar12;
  sexp_conflict psVar13;
  sexp_heap_conflict psVar14;
  sexp_conflict local_10b0;
  sexp_conflict stats_res;
  sexp_conflict tmp;
  int local_1094;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  size_t freed;
  sexp_uint_t sizes [256];
  sexp_uint_t stats [256];
  
  psVar14 = (ctx->value).context.heap;
  stats_res = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  local_10b0 = (sexp_conflict)0x43e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  tmp = (sexp_conflict)0x43e;
  __sexp_gc_preserver3.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver3.next = (sexp_gc_var_t *)0x0;
  name = (sexp_conflict)0x43e;
  __sexp_gc_preserver4.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver4.next = (sexp_gc_var_t *)0x0;
  local_1094 = depth;
  if (printp == 0) {
    psVar8 = (sexp_conflict)0x3e;
  }
  else {
    uVar7 = sexp_env_ref(ctx,(ctx->value).type.cpl,
                         (((ctx->value).type.setters)->value).context.mark_stack[3].end,0x3e);
    psVar8 = (sexp_conflict)sexp_parameter_ref(ctx,uVar7);
  }
  sexp_gc(ctx,&freed);
  for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
    stats[lVar9] = 0;
    sizes[lVar9] = 0;
  }
  uVar12 = 0;
  do {
    if (psVar14 == (sexp_heap_conflict)0x0) {
      __sexp_gc_preserver1.var = &stats_res;
      __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
      __sexp_gc_preserver1.next = (ctx->value).context.saves;
      __sexp_gc_preserver2.var = &local_10b0;
      __sexp_gc_preserver3.next = &__sexp_gc_preserver2;
      __sexp_gc_preserver3.var = &tmp;
      __sexp_gc_preserver4.next = &__sexp_gc_preserver3;
      __sexp_gc_preserver4.var = &name;
      (ctx->value).context.saves = &__sexp_gc_preserver4;
      stats_res = (sexp_conflict)0x23e;
      for (; 0 < (long)uVar12; uVar12 = uVar12 - 1) {
        sVar2 = stats[uVar12];
        if (sVar2 != 0) {
          name = (sexp_conflict)
                 sexp_string_to_symbol_op
                           (ctx,0,1,*(undefined8 *)
                                     (*(long *)((long)&((((ctx->value).type.setters)->value).type.
                                                       getters)->value + uVar12 * 8 + 8) + 8));
          tmp = (sexp_conflict)sexp_cons_op(ctx,0,2,name,sVar2 * 2 + 1);
          stats_res = (sexp_conflict)sexp_cons_op(ctx,0,2,tmp,stats_res);
        }
      }
      local_10b0 = (sexp_conflict)0x23e;
      psVar8 = (sexp_conflict)0x23e;
      for (lVar9 = 0xff; -1 < lVar9; lVar9 = lVar9 + -1) {
        if (sizes[lVar9] != 0) {
          tmp = (sexp_conflict)sexp_cons_op(ctx,0,2,lVar9 * 2 + 1,sizes[lVar9] * 2 + 1);
          psVar8 = (sexp_conflict)sexp_cons_op(ctx,0,2,tmp,local_10b0);
          local_10b0 = psVar8;
        }
      }
      psVar8 = (sexp_conflict)sexp_cons_op(ctx,0,2,stats_res,psVar8);
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
      return psVar8;
    }
    psVar13 = (sexp_conflict)psVar14->free_list;
    pcVar1 = psVar14->data;
    x = (sexp_conflict)(pcVar1 + 0x20);
    sVar2 = psVar14->size;
    while (psVar3 = psVar13, x < (sexp_conflict)(pcVar1 + sVar2)) {
      do {
        psVar13 = psVar3;
        psVar3 = (psVar13->value).type.name;
        if (psVar3 == (sexp_conflict)0x0) break;
      } while (psVar3 < x);
      if (psVar3 == x) {
        x = (sexp_conflict)((long)&x->tag + *(long *)psVar3);
      }
      else {
        if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag == 0x11)) {
          sexp_print_simple(ctx,x,psVar8,local_1094);
          psVar4 = (psVar8->value).type.setters;
          if (psVar4 == (sexp)0x0) {
            putc(10,(FILE *)(psVar8->value).type.getters);
          }
          else {
            psVar5 = (psVar8->value).type.print;
            if (psVar5 < (sexp)(psVar8->value).port.size) {
              (psVar8->value).type.print = (sexp)((long)&psVar5->tag + 1);
              *(undefined1 *)((long)&psVar5->tag + (long)&psVar4->tag) = 10;
            }
            else {
              sexp_buffered_write_char(ctx,10);
            }
          }
        }
        uVar6 = x->tag;
        if (0xfe < x->tag) {
          uVar6 = 0xff;
        }
        stats[uVar6] = stats[uVar6] + 1;
        lVar9 = sexp_allocated_bytes(ctx,x);
        uVar10 = lVar9 + 0x1f;
        uVar11 = uVar10 >> 5;
        if (0x1fff < uVar10) {
          uVar11 = 0xff;
        }
        sizes[uVar11] = sizes[uVar11] + 1;
        if (uVar12 <= x->tag) {
          uVar12 = (ulong)x->tag;
        }
        x = (sexp_conflict)((long)&x->tag + (uVar10 & 0xffffffffffffffe0));
      }
    }
    psVar14 = psVar14->next;
  } while( true );
}

Assistant:

static sexp sexp_heap_walk (sexp ctx, int depth, int printp) {
  size_t freed;
  sexp_uint_t stats[256], sizes[256], hi_type=0, size;
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp p, out=SEXP_FALSE;
  sexp_free_list q, r;
  char *end;
  sexp_gc_var4(stats_res, res, tmp, name);

  if (printp)
    out = sexp_parameter_ref(ctx,
                             sexp_env_ref(ctx,
                                          sexp_context_env(ctx),
                                          sexp_global(ctx,SEXP_G_CUR_OUT_SYMBOL),
                                          SEXP_FALSE));

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<256; i++) { stats[i]=0; sizes[i]=0; }

  /* loop over each heap chunk */
  for ( ; h; h=h->next) {
    p = (sexp) (h->data + sexp_heap_align(sexp_sizeof(pair)));
    q = h->free_list;
    end = (char*)h->data + h->size;
    while (((char*)p) < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      /* otherwise maybe print, then increment the stat and continue */
      if (sexp_oportp(out)) {
        sexp_print_simple(ctx, p, out, depth);
        sexp_write_char(ctx, '\n', out);
      }
      stats[sexp_pointer_tag(p) > 255 ? 255 : sexp_pointer_tag(p)]++;
      size = sexp_heap_align(sexp_allocated_bytes(ctx, p));
      sizes[sexp_heap_chunks(size) > 255 ? 255 : sexp_heap_chunks(size)]++;
      if (sexp_pointer_tag(p) > hi_type)
        hi_type = sexp_pointer_tag(p);
      p = (sexp) (((char*)p) + size);
    }
  }

  /* build and return results */
  sexp_gc_preserve4(ctx, stats_res, res, tmp, name);
  stats_res = SEXP_NULL;
  for (i=hi_type; i>0; i--)
    if (stats[i]) {
      name = sexp_string_to_symbol(ctx, sexp_type_name_by_index(ctx, i));
      tmp = sexp_cons(ctx, name, sexp_make_fixnum(stats[i]));
      stats_res = sexp_cons(ctx, tmp, stats_res);
    }
  res = SEXP_NULL;
  for (i=255; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  res = sexp_cons(ctx, stats_res, res);
  sexp_gc_release4(ctx);
  return res;
}